

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHalf.cpp
# Opt level: O0

uint16_t Ptex::v2_4::PtexHalf::fromFloat_except(uint32_t i)

{
  int iVar1;
  uint in_EDI;
  double dVar2;
  anon_union_4_2_947300a4 u;
  int32_t e;
  uint32_t s;
  undefined2 local_2;
  
  local_2 = (ushort)(in_EDI >> 0x10) & 0x8000;
  iVar1 = (in_EDI >> 0xd & 0x3fc00) - 0x1c000;
  if (iVar1 < 1) {
    dVar2 = std::fabs((double)(ulong)in_EDI);
    local_2 = local_2 | (ushort)(int)(SUB84(dVar2,0) * 16777216.0 + 0.5);
  }
  else if (iVar1 == 0x23c00) {
    local_2 = local_2 | 0x7c00 | (ushort)((in_EDI & 0x7fffff) >> 0xd);
  }
  else {
    local_2 = local_2 | 0x7c00;
  }
  return local_2;
}

Assistant:

uint16_t PtexHalf::fromFloat_except(uint32_t i)
{
    uint32_t s = ((i>>16) & 0x8000);
    int32_t e = ((i>>13) & 0x3fc00) - 0x1c000;

    if (e <= 0) {
        // denormalized
        union { uint32_t i; float f; } u;
        u.i = i;
        return (uint16_t)(s|int(fabs(u.f)*1.6777216e7 + .5));
    }

    if (e == 0x23c00)
        // inf/nan, preserve msb bits of m for nan code
        return (uint16_t)(s|0x7c00|((i&0x7fffff)>>13));
    else
        // overflow - convert to inf
        return (uint16_t)(s|0x7c00);
}